

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

void qrfac(double *A,int M,int N,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double eps)

{
  size_t __size;
  int iVar1;
  double *col;
  void *__ptr;
  double *x;
  long lVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  if (1 < (uint)pivot) {
    puts("Pivot only takes binary values 0 and 1 ");
    exit(-1);
  }
  lVar17 = (long)N;
  __size = lVar17 * 8;
  lVar15 = (long)M;
  col = (double *)malloc(__size * lVar15);
  __ptr = malloc(__size);
  x = (double *)malloc(lVar15 * 8);
  mtranspose(A,M,N,col);
  uVar12 = 0;
  uVar16 = 0;
  pdVar3 = col;
  if (0 < N) {
    uVar16 = (ulong)(uint)N;
  }
  for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
    dVar21 = enorm(pdVar3,M);
    acnorm[uVar12] = dVar21;
    rdiag[uVar12] = dVar21;
    *(double *)((long)__ptr + uVar12 * 8) = dVar21;
    if (pivot == 1) {
      ipvt[uVar12] = (int)uVar12;
    }
    pdVar3 = pdVar3 + lVar15;
  }
  uVar4 = N;
  if (M < N) {
    uVar4 = M;
  }
  uVar12 = 0;
  if (0 < M) {
    uVar12 = (ulong)(uint)M;
  }
  uVar16 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar16 = 0;
  }
  iVar10 = 1;
  uVar9 = 0;
  while( true ) {
    uVar13 = uVar9 & 0xffffffff;
    if ((int)uVar9 < M) {
      uVar13 = (ulong)(uint)M;
    }
    if (uVar9 == uVar16) break;
    if (pivot == 1) {
      uVar8 = uVar9 & 0xffffffff;
      uVar5 = uVar9;
      while( true ) {
        lVar2 = (long)(int)(uint)uVar8;
        if ((uint)N == uVar5) break;
        uVar4 = (uint)uVar5;
        if (rdiag[uVar5] < rdiag[lVar2] || rdiag[uVar5] == rdiag[lVar2]) {
          uVar4 = (uint)uVar8;
        }
        uVar5 = uVar5 + 1;
        uVar8 = (ulong)uVar4;
      }
      pdVar3 = A;
      uVar5 = uVar12;
      if (uVar9 != uVar8) {
        while (uVar5 != 0) {
          dVar21 = pdVar3[uVar9];
          pdVar3[uVar9] = pdVar3[lVar2];
          pdVar3[lVar2] = dVar21;
          pdVar3 = pdVar3 + lVar17;
          uVar5 = uVar5 - 1;
        }
        rdiag[lVar2] = rdiag[uVar9];
        *(undefined8 *)((long)__ptr + lVar2 * 8) = *(undefined8 *)((long)__ptr + uVar9 * 8);
        iVar11 = ipvt[uVar9];
        ipvt[uVar9] = ipvt[lVar2];
        ipvt[lVar2] = iVar11;
      }
    }
    lVar19 = (long)iVar10;
    lVar2 = uVar9 * lVar17 + uVar9;
    lVar18 = lVar15 - uVar9;
    pdVar3 = A + lVar2;
    for (lVar6 = 0; lVar6 < lVar18; lVar6 = lVar6 + 1) {
      x[lVar6] = *pdVar3;
      pdVar3 = pdVar3 + lVar17;
    }
    dVar21 = enorm(x,(int)lVar18);
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      dVar21 = (double)(~-(ulong)(A[lVar2] < 0.0) & (ulong)dVar21 |
                       (ulong)-dVar21 & -(ulong)(A[lVar2] < 0.0));
      lVar6 = (lVar17 * 8 + 8) * uVar9;
      pdVar3 = (double *)((long)A + lVar6);
      for (uVar5 = uVar13; uVar9 != uVar5; uVar5 = uVar5 - 1) {
        *pdVar3 = *pdVar3 / dVar21;
        pdVar3 = pdVar3 + lVar17;
      }
      A[lVar2] = A[lVar2] + 1.0;
      if ((long)uVar9 <= lVar17 + -2) {
        lVar14 = __size * uVar9 + lVar19 * 8;
        iVar11 = ((int)uVar9 + 1) * N + iVar10;
        for (; lVar19 < lVar17; lVar19 = lVar19 + 1) {
          dVar22 = 0.0;
          pdVar3 = A;
          lVar7 = uVar13 - uVar9;
          while (bVar20 = lVar7 != 0, lVar7 = lVar7 + -1, bVar20) {
            dVar22 = dVar22 + *(double *)((long)pdVar3 + lVar6) * *(double *)((long)pdVar3 + lVar14)
            ;
            pdVar3 = pdVar3 + lVar17;
          }
          dVar23 = A[lVar2];
          pdVar3 = A;
          lVar7 = uVar13 - uVar9;
          while (bVar20 = lVar7 != 0, lVar7 = lVar7 + -1, bVar20) {
            *(double *)((long)pdVar3 + lVar14) =
                 *(double *)((long)pdVar3 + lVar6) * (-dVar22 / dVar23) +
                 *(double *)((long)pdVar3 + lVar14);
            pdVar3 = pdVar3 + lVar17;
          }
          if (pivot == 1) {
            dVar22 = rdiag[lVar19];
            if ((dVar22 != 0.0) || (NAN(dVar22))) {
              dVar23 = pmax(0.0,1.0 - (A[uVar9 * lVar17 + lVar19] / dVar22) *
                                      (A[uVar9 * lVar17 + lVar19] / dVar22));
              dVar22 = rdiag[lVar19];
              if (dVar23 < 0.0) {
                dVar23 = sqrt(dVar23);
              }
              else {
                dVar23 = SQRT(dVar23);
              }
              rdiag[lVar19] = dVar22 * dVar23;
              dVar22 = ((dVar22 * dVar23) / *(double *)((long)__ptr + lVar19 * 8)) * 0.05;
              if (dVar22 * dVar22 <= eps) {
                iVar1 = iVar11;
                for (lVar7 = 0; lVar7 < lVar18 + -1; lVar7 = lVar7 + 1) {
                  x[lVar7] = A[iVar1];
                  iVar1 = iVar1 + N;
                }
                dVar22 = enorm(x,(int)(lVar18 + -1));
                rdiag[lVar19] = dVar22;
                *(double *)((long)__ptr + lVar19 * 8) = dVar22;
              }
            }
          }
          lVar14 = lVar14 + 8;
          iVar11 = iVar11 + 1;
        }
      }
    }
    rdiag[uVar9] = -dVar21;
    iVar10 = iVar10 + 1;
    uVar9 = uVar9 + 1;
  }
  free(col);
  free(__ptr);
  free(x);
  return;
}

Assistant:

void qrfac(double *A, int M, int N, int lda, int pivot, int *ipvt, int lipvt,double *rdiag, double *acnorm,double eps) {
	int i,j,jp1,k,kmax,minmn,t;
    double ajnorm,epsmch,one,p05,sum,temp,zero,temp2,pmaxval;
    double *AT,*wa,*wa2;

 /*
     * This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
     *
     * M is a positive integer input variable set to the number
         of rows of a.

       N is a positive integer input variable set to the number
         of columns of a.

       A is an M by N array. on input a contains the matrix for
         which the qr factorization is to be computed. on output
         the strict upper trapezoidal part of a contains the strict
         upper trapezoidal part of r, and the lower trapezoidal
         part of a contains a factored form of q (the non-trivial
         elements of the u vectors described above).

       lda is a positive integer input variable not less than m
         which specifies the leading dimension of the array a.

       pivot is an integer input variable. if pivot is set to 1,
         then column pivoting is enforced. if pivot is set to 0,
         then no column pivoting is done.

       ipvt is an integer output array of length lipvt. ipvt
         defines the permutation matrix p such that a*p = q*r.
         column j of p is column ipvt(j) of the identity matrix.
         if pivot is false, ipvt is not referenced.

       lipvt is a positive integer input variable. if pivot is false,
         then lipvt may be as small as 1. if pivot is true, then
         lipvt must be at least n.

       rdiag is an output array of length N which contains the
         diagonal elements of r.

       acnorm is an output array of length N which contains the
         norms of the corresponding columns of the input matrix a.
         if this information is not needed, then acnorm can coincide
         with rdiag.
     *
     */


    if (pivot != 0 && pivot != 1) {
    	printf("Pivot only takes binary values 0 and 1 \n");
    	exit(-1);
    }

    AT = (double*) malloc(sizeof(double) *N*M);
    wa = (double*) malloc(sizeof(double) *N);
    wa2 = (double*) malloc(sizeof(double) *M);

    one = 1.0; zero = 0.0; p05 = 5.0e-02;
    epsmch = eps;

    mtranspose(A,M,N,AT);// AT is size NXM

    //compute the initial column norms and initialize several arrays.

    for(j = 0; j < N;++j) {
    	acnorm[j] = enorm(AT+j*M,M);
    	rdiag[j] = acnorm[j];
    	wa[j] = rdiag[j];
    	if (pivot == 1) {
    		ipvt[j] = j;
    	}
    }

    //reduce a to r with householder transformations.

    if (M < N) {
    	minmn = M;
    } else {
    	minmn = N;
    }

    for (j = 0; j < minmn;++j) {
    	if (pivot == 1) {
    		//bring the column of largest norm into the pivot position.
    		kmax = j;
    		for(k = j; k < N;++k) {
    			if (rdiag[k] > rdiag[kmax]) {
    				kmax = k;
    			}
    		}
			if (kmax != j) {
				for(i = 0; i < M;++i) {
					t = i * N;
					temp = A[t+j];
					A[t+j] = A[t+kmax];
					A[t+kmax] = temp;
				}
				rdiag[kmax] = rdiag[j];
				wa[kmax] = wa[j];
				k = ipvt[j];
				ipvt[j] = ipvt[kmax];
				ipvt[kmax] = k;
			}
    	}
    	//        compute the householder transformation to reduce the
    	//       j-th column of a to a multiple of the j-th unit vector.
    	t = j * N + j;

    	for(i = 0; i < M-j;++i) {
    		wa2[i] = A[t+i*N];
    	}
    	ajnorm = enorm(wa2,M-j);
    	if (ajnorm != zero) {
    		if (A[t] < zero) {
    			ajnorm = - ajnorm;
    		}
    		for(i = j; i < M;++i) {
    			A[i*N+j] /= ajnorm;
    		}
    		A[t] += one;
    		//        apply the transformation to the remaining columns
    		//        and update the norms.

    		jp1 = j + 1; // Breakpoint
    		if (N >= jp1+1) {
    			for(k = jp1; k < N;++k) {
    				sum = zero;
    				for(i = j; i < M;++i) {
    					sum += (A[i*N+j] * A[i*N+k]);
    				}
    				temp = sum / A[t];
    				for(i = j; i < M;++i) {
    					A[i*N+k] -= (temp * A[i*N+j]);
    				}
    				// Breakpoint 2
    				if (pivot == 1 && rdiag[k] != zero) {
    					temp = A[j*N+k] / rdiag[k];
						pmaxval = pmax(zero, one - temp*temp);
    					rdiag[k] = rdiag[k]*sqrt(pmaxval);
    					temp2 = (p05*(rdiag[k]/wa[k]));
    					temp2 = temp2 * temp2;
    					if (temp2 <= epsmch) {
    				    	for(i = 0; i < M-j-1;++i) {
    				    		wa2[i] = A[jp1*N+k+i*N];
    				    	}
    				    	rdiag[k] = enorm(wa2,M-j-1);
    				    	wa[k] = rdiag[k];
    					}
    				}
    			}
    		}
    	}
    	rdiag[j] = -ajnorm;
    }

    free(AT);
    free(wa);
    free(wa2);
}